

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void preptypeinfo(rnndb *db,rnntypeinfo *ti,char *prefix,rnnvarinfo *vi,int width,char *file)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  rnnvalue *prVar4;
  rnnbitfield *prVar5;
  undefined8 in_RDX;
  long *in_RSI;
  long in_RDI;
  int in_R8D;
  int j_1;
  int j;
  rnnspectype *st;
  rnnbitset *bs;
  rnnenum *en;
  int i;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  rnnbitfield *in_stack_ffffffffffffffb0;
  rnnbitfield *in_stack_ffffffffffffffb8;
  rnndb *in_stack_ffffffffffffffc0;
  int local_34;
  
  if (*in_RSI == 0) {
    if ((int)in_RSI[6] == 0) {
      if ((int)in_RSI[8] == 0) {
        if (in_R8D == 1) {
          *in_RSI = (long)"boolean";
          *(undefined4 *)(in_RSI + 1) = 9;
        }
        else {
          *in_RSI = (long)"hex";
          *(undefined4 *)(in_RSI + 1) = 5;
        }
      }
      else {
        *in_RSI = (long)"enum";
        *(undefined4 *)(in_RSI + 1) = 0;
      }
    }
    else {
      *in_RSI = (long)"bitfield";
      *(undefined4 *)(in_RSI + 1) = 1;
    }
  }
  else {
    in_stack_ffffffffffffffc0 =
         (rnndb *)rnn_findenum((rnndb *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0)
    ;
    in_stack_ffffffffffffffb8 =
         (rnnbitfield *)
         rnn_findbitset((rnndb *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb0 =
         (rnnbitfield *)
         rnn_findspectype((rnndb *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0);
    if (in_stack_ffffffffffffffc0 == (rnndb *)0x0) {
      if (in_stack_ffffffffffffffb8 == (rnnbitfield *)0x0) {
        if (in_stack_ffffffffffffffb0 == (rnnbitfield *)0x0) {
          iVar2 = strcmp((char *)*in_RSI,"hex");
          if (iVar2 == 0) {
            *(undefined4 *)(in_RSI + 1) = 5;
          }
          else {
            iVar2 = strcmp((char *)*in_RSI,"float");
            if (iVar2 == 0) {
              *(undefined4 *)(in_RSI + 1) = 8;
            }
            else {
              iVar2 = strcmp((char *)*in_RSI,"uint");
              if (iVar2 == 0) {
                *(undefined4 *)(in_RSI + 1) = 7;
              }
              else {
                iVar2 = strcmp((char *)*in_RSI,"int");
                if (iVar2 == 0) {
                  *(undefined4 *)(in_RSI + 1) = 6;
                }
                else {
                  iVar2 = strcmp((char *)*in_RSI,"boolean");
                  if (iVar2 == 0) {
                    *(undefined4 *)(in_RSI + 1) = 9;
                  }
                  else {
                    iVar2 = strcmp((char *)*in_RSI,"bitfield");
                    if (iVar2 == 0) {
                      *(undefined4 *)(in_RSI + 1) = 1;
                    }
                    else {
                      iVar2 = strcmp((char *)*in_RSI,"enum");
                      if (iVar2 == 0) {
                        *(undefined4 *)(in_RSI + 1) = 0;
                      }
                      else {
                        *(undefined4 *)(in_RSI + 1) = 5;
                        fprintf(_stderr,"%s: unknown type %s\n",in_RDX,*in_RSI);
                        *(undefined4 *)(in_RDI + 0x80) = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          *(undefined4 *)(in_RSI + 1) = 4;
          in_RSI[4] = (long)in_stack_ffffffffffffffb0;
        }
      }
      else if (in_stack_ffffffffffffffb8->high == 0) {
        *(undefined4 *)(in_RSI + 1) = 3;
        in_RSI[3] = (long)in_stack_ffffffffffffffb8;
      }
      else {
        *(undefined4 *)(in_RSI + 1) = 1;
        for (in_stack_ffffffffffffffa8 = 0;
            in_stack_ffffffffffffffa8 < *(int *)&(in_stack_ffffffffffffffb8->typeinfo).name;
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
          if (*(int *)((long)in_RSI + 0x34) <= (int)in_RSI[6]) {
            if (*(int *)((long)in_RSI + 0x34) == 0) {
              *(undefined4 *)((long)in_RSI + 0x34) = 0x10;
            }
            else {
              *(int *)((long)in_RSI + 0x34) = *(int *)((long)in_RSI + 0x34) << 1;
            }
            pvVar3 = realloc((void *)in_RSI[5],(long)*(int *)((long)in_RSI + 0x34) << 3);
            in_RSI[5] = (long)pvVar3;
          }
          prVar5 = copybitfield(in_stack_ffffffffffffffb0,
                                (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ));
          lVar1 = in_RSI[6];
          *(int *)(in_RSI + 6) = (int)lVar1 + 1;
          *(rnnbitfield **)(in_RSI[5] + (long)(int)lVar1 * 8) = prVar5;
        }
      }
    }
    else if (*(int *)((long)&(in_stack_ffffffffffffffc0->copyright).license + 4) == 0) {
      *(undefined4 *)(in_RSI + 1) = 2;
      in_RSI[2] = (long)in_stack_ffffffffffffffc0;
    }
    else {
      *(undefined4 *)(in_RSI + 1) = 0;
      for (in_stack_ffffffffffffffac = 0;
          in_stack_ffffffffffffffac < in_stack_ffffffffffffffc0->groupsnum;
          in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
        if (*(int *)((long)in_RSI + 0x44) <= (int)in_RSI[8]) {
          if (*(int *)((long)in_RSI + 0x44) == 0) {
            *(undefined4 *)((long)in_RSI + 0x44) = 0x10;
          }
          else {
            *(int *)((long)in_RSI + 0x44) = *(int *)((long)in_RSI + 0x44) << 1;
          }
          pvVar3 = realloc((void *)in_RSI[7],(long)*(int *)((long)in_RSI + 0x44) << 3);
          in_RSI[7] = (long)pvVar3;
        }
        prVar4 = copyvalue((rnnvalue *)in_stack_ffffffffffffffb0,
                           (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        lVar1 = in_RSI[8];
        *(int *)(in_RSI + 8) = (int)lVar1 + 1;
        *(rnnvalue **)(in_RSI[7] + (long)(int)lVar1 * 8) = prVar4;
      }
    }
  }
  for (local_34 = 0; local_34 < (int)in_RSI[6]; local_34 = local_34 + 1) {
    prepbitfield(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (char *)in_stack_ffffffffffffffb0,
                 (rnnvarinfo *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  for (local_34 = 0; local_34 < (int)in_RSI[8]; local_34 = local_34 + 1) {
    prepvalue(in_stack_ffffffffffffffc0,(rnnvalue *)in_stack_ffffffffffffffb8,
              (char *)in_stack_ffffffffffffffb0,
              (rnnvarinfo *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

static void preptypeinfo(struct rnndb *db, struct rnntypeinfo *ti, char *prefix, struct rnnvarinfo *vi, int width, char *file) {
	int i;
	if (ti->name) {
		struct rnnenum *en = rnn_findenum (db, ti->name);
		struct rnnbitset *bs = rnn_findbitset (db, ti->name);
		struct rnnspectype *st = rnn_findspectype (db, ti->name);
		if (en) {
			if (en->isinline) {
				ti->type = RNN_TTYPE_INLINE_ENUM;
				int j;
				for (j = 0; j < en->valsnum; j++)
					ADDARRAY(ti->vals, copyvalue(en->vals[j], file));
			} else {
				ti->type = RNN_TTYPE_ENUM;
				ti->eenum = en;
			}
		} else if (bs) {
			if (bs->isinline) {
				ti->type = RNN_TTYPE_INLINE_BITSET;
				int j;
				for (j = 0; j < bs->bitfieldsnum; j++)
					ADDARRAY(ti->bitfields, copybitfield(bs->bitfields[j], file));
			} else {
				ti->type = RNN_TTYPE_BITSET;
				ti->ebitset = bs;
			}
		} else if (st) {
			ti->type = RNN_TTYPE_SPECTYPE;
			ti->spectype = st;
		} else if (!strcmp(ti->name, "hex")) {
			ti->type = RNN_TTYPE_HEX;
		} else if (!strcmp(ti->name, "float")) {
			ti->type = RNN_TTYPE_FLOAT;
		} else if (!strcmp(ti->name, "uint")) {
			ti->type = RNN_TTYPE_UINT;
		} else if (!strcmp(ti->name, "int")) {
			ti->type = RNN_TTYPE_INT;
		} else if (!strcmp(ti->name, "boolean")) {
			ti->type = RNN_TTYPE_BOOLEAN;
		} else if (!strcmp(ti->name, "bitfield")) {
			ti->type = RNN_TTYPE_INLINE_BITSET;
		} else if (!strcmp(ti->name, "enum")) {
			ti->type = RNN_TTYPE_INLINE_ENUM;
		} else {
			ti->type = RNN_TTYPE_HEX;
			fprintf (stderr, "%s: unknown type %s\n", prefix, ti->name);
			db->estatus = 1;
		}
	} else if (ti->bitfieldsnum) {
		ti->name = "bitfield";
		ti->type = RNN_TTYPE_INLINE_BITSET;
	} else if (ti->valsnum) {
		ti->name = "enum";
		ti->type = RNN_TTYPE_INLINE_ENUM;
	} else if (width == 1) {
		ti->name = "boolean";
		ti->type = RNN_TTYPE_BOOLEAN;
	} else {
		ti->name = "hex";
		ti->type = RNN_TTYPE_HEX;
	}
	for (i = 0; i < ti->bitfieldsnum; i++)
		prepbitfield(db,  ti->bitfields[i], prefix, vi);
	for (i = 0; i < ti->valsnum; i++)
		prepvalue(db, ti->vals[i], prefix, vi);
}